

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

void __thiscall
google::protobuf::util::Status::Status(Status *this,Code error_code,StringPiece error_message)

{
  StringPiece local_40;
  string local_30;
  
  local_40.length_ = error_message.length_;
  local_40.ptr_ = error_message.ptr_;
  this->error_code_ = error_code;
  (this->error_message_)._M_dataplus._M_p = (pointer)&(this->error_message_).field_2;
  (this->error_message_)._M_string_length = 0;
  (this->error_message_).field_2._M_local_buf[0] = '\0';
  if (error_code != OK) {
    StringPiece::ToString_abi_cxx11_(&local_30,&local_40);
    std::__cxx11::string::operator=((string *)&this->error_message_,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

Status::Status(error::Code error_code, StringPiece error_message)
    : error_code_(error_code) {
  if (error_code != error::OK) {
    error_message_ = error_message.ToString();
  }
}